

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vgmplayer_cmdhandler.cpp
# Opt level: O2

void __thiscall VGMPlayer::Cmd_RF5C_Reg(VGMPlayer *this)

{
  UINT8 chipType;
  byte chipID;
  CHIP_DEVICE *pCVar1;
  byte bVar2;
  
  chipType = _CMD_INFO[this->_fileData[this->_filePos]].chipType;
  chipID = this->_fileData[(ulong)this->_filePos + 1] >> 7;
  pCVar1 = GetDevicePtr(this,chipType,chipID);
  if ((pCVar1 != (CHIP_DEVICE *)0x0) && (pCVar1->write8 != (DEVFUNC_WRITE_A8D8)0x0)) {
    bVar2 = this->_fileData[(ulong)this->_filePos + 1] & 0x7f;
    (*pCVar1->write8)((pCVar1->base).defInf.dataPtr,bVar2,this->_fileData[(ulong)this->_filePos + 2]
                     );
    if ((bVar2 == 7) && ((this->_fileData[(ulong)this->_filePos + 2] & 0x40) == 0)) {
      this->_rf5cBank[chipType == '\x10'][chipID] = this->_fileData[(ulong)this->_filePos + 2] & 0xf
      ;
    }
  }
  return;
}

Assistant:

void VGMPlayer::Cmd_RF5C_Reg(void)
{
	UINT8 chipType = _CMD_INFO[fData[0x00]].chipType;
	UINT8 chipID = (fData[0x01] & 0x80) >> 7;
	CHIP_DEVICE* cDev = GetDevicePtr(chipType, chipID);
	if (cDev == NULL || cDev->write8 == NULL)
		return;
	
	UINT8 ofs = fData[0x01] & 0x7F;
	cDev->write8(cDev->base.defInf.dataPtr, ofs, fData[0x02]);
	
	// RF5C68 bank patch
	if (ofs == 0x07 && ! (fData[0x02] & 0x40))
	{
		UINT8 rfNum = (chipType == 0x10) ? 1 : 0;
		_rf5cBank[rfNum][chipID] = fData[0x02] & 0x0F;
	}
	
	return;
}